

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init_gnss_glo(fsnav_gnss_glo *glo,size_t max_sat_count,size_t max_eph_count)

{
  fsnav_gnss_sat *pfVar1;
  int *piVar2;
  double *pdVar3;
  ulong local_30;
  size_t i;
  size_t max_eph_count_local;
  size_t max_sat_count_local;
  fsnav_gnss_glo *glo_local;
  
  glo->sat = (fsnav_gnss_sat *)0x0;
  glo->freq_slot = (int *)0x0;
  glo->max_sat_count = 0;
  glo->max_eph_count = 0;
  pfVar1 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  glo->sat = pfVar1;
  if (glo->sat == (fsnav_gnss_sat *)0x0) {
    glo_local._7_1_ = '\0';
  }
  else {
    piVar2 = (int *)calloc(max_sat_count,4);
    glo->freq_slot = piVar2;
    glo->max_sat_count = max_sat_count;
    for (local_30 = 0; local_30 < glo->max_sat_count; local_30 = local_30 + 1) {
      fsnav_init_gnss_sat(glo->sat + local_30);
    }
    for (local_30 = 0; local_30 < glo->max_sat_count; local_30 = local_30 + 1) {
      pdVar3 = (double *)calloc(max_eph_count,8);
      glo->sat[local_30].eph = pdVar3;
      if (glo->sat[local_30].eph == (double *)0x0) {
        return '\0';
      }
    }
    glo->max_eph_count = max_eph_count;
    glo->obs_types = (char (*) [4])0x0;
    glo->obs_count = 0;
    glo_local._7_1_ = '\x01';
  }
  return glo_local._7_1_;
}

Assistant:

char fsnav_init_gnss_glo(fsnav_gnss_glo* glo, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	glo->sat = NULL;
	glo->freq_slot = NULL;
	glo->max_sat_count = 0;
	glo->max_eph_count = 0;

	// try to allocate memory for satellite data
	glo->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (glo->sat == NULL)
		return 0;
	glo->freq_slot = (int*)calloc(max_sat_count, sizeof(int));
	glo->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < glo->max_sat_count; i++)
		fsnav_init_gnss_sat(glo->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < glo->max_sat_count; i++) {
		glo->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (glo->sat[i].eph == NULL)
			return 0;
	}
	glo->max_eph_count = max_eph_count;

	// observation types
	glo->obs_types = NULL;
	glo->obs_count = 0;

	return 1;
}